

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::CheckTypeAndMergeFrom
          (BayesianProbitRegressor_FeatureValueWeight *this,MessageLite *from)

{
  uint32_t uVar1;
  ulong uVar2;
  LogMessage *other;
  BayesianProbitRegressor_Gaussian *this_00;
  undefined1 *from_00;
  Arena *arena;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite !=
      (_func_int **)&PTR__BayesianProbitRegressor_FeatureValueWeight_004906e0) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((BayesianProbitRegressor_FeatureValueWeight *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/BayesianProbitRegressor.pb.cc"
               ,0x1f5);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  from_00 = (undefined1 *)from[1]._vptr_MessageLite;
  if ((BayesianProbitRegressor_Gaussian *)from_00 != (BayesianProbitRegressor_Gaussian *)0x0 &&
      from != (MessageLite *)_BayesianProbitRegressor_FeatureValueWeight_default_instance_) {
    this_00 = this->featureweight_;
    if (this_00 == (BayesianProbitRegressor_Gaussian *)0x0) {
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      arena = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      this_00 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::BayesianProbitRegressor_Gaussian>(arena);
      this->featureweight_ = this_00;
      from_00 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    if ((BayesianProbitRegressor_Gaussian *)from_00 == (BayesianProbitRegressor_Gaussian *)0x0) {
      from_00 = _BayesianProbitRegressor_Gaussian_default_instance_;
    }
    BayesianProbitRegressor_Gaussian::MergeFrom(this_00,(BayesianProbitRegressor_Gaussian *)from_00)
    ;
  }
  uVar1 = (uint32_t)from[1]._internal_metadata_.ptr_;
  if (uVar1 != 0) {
    this->featurevalue_ = uVar1;
  }
  uVar2 = (from->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}